

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall dumper::dumproot(dumper *this)

{
  uint32_t uVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  roots *local_18;
  roots *r;
  dumper *this_local;
  
  r = (roots *)this;
  local_18 = getroot(this,0);
  if (local_18 == (roots *)0x0) {
    printf("could not find root\n");
  }
  else {
    (*this->_vptr_dumper[4])();
    uVar1 = ent::roots::hiveid(local_18,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HKCR",&local_39);
    dumpkeys(this,uVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    uVar1 = ent::roots::hiveid(local_18,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"HKCU",&local_71);
    dumpkeys(this,uVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    uVar1 = ent::roots::hiveid(local_18,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"HKLM",&local_99);
    dumpkeys(this,uVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  return;
}

Assistant:

void dumproot()            
    {
        ent::roots *r= getroot(0);
        if (!r) {
            printf("could not find root\n");
            return;
        }
        dumproots(r);

        dumpkeys(r->hiveid((HKEY)ent::HKCR), "HKCR");
        dumpkeys(r->hiveid((HKEY)ent::HKCU), "HKCU");
        dumpkeys(r->hiveid((HKEY)ent::HKLM), "HKLM");
    }